

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll-test.c
# Opt level: O1

void * datagram_connector(void *arg)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  sockaddr_in addr;
  sockaddr local_18;
  
  iVar1 = socket(2,0x80002,0);
  if (iVar1 < 0) {
    pcVar3 = "sock >= 0";
    uVar4 = 0x67a;
  }
  else {
    local_18.sa_data[6] = '\0';
    local_18.sa_data[7] = '\0';
    local_18.sa_data[8] = '\0';
    local_18.sa_data[9] = '\0';
    local_18.sa_data[10] = '\0';
    local_18.sa_data[0xb] = '\0';
    local_18.sa_data[0xc] = '\0';
    local_18.sa_data[0xd] = '\0';
    local_18.sa_family = 2;
    local_18.sa_data[0] = '\x05';
    local_18.sa_data[1] = '9';
    local_18.sa_data[2] = '\0';
    local_18.sa_data[3] = '\0';
    local_18.sa_data[4] = '\0';
    local_18.sa_data[5] = '\0';
    iVar2 = inet_pton(2,"127.0.0.1",local_18.sa_data + 2);
    if (iVar2 == 1) {
      iVar1 = connect(iVar1,&local_18,0x10);
      if (iVar1 == 0) {
        datagram_connector_cold_1();
        return (void *)0x0;
      }
      pcVar3 = "connect(sock, (struct sockaddr const *)&addr, sizeof(addr)) == 0";
      uVar4 = 0x682;
    }
    else {
      pcVar3 = "inet_pton(AF_INET, \"127.0.0.1\", &addr.sin_addr) == 1";
      uVar4 = 0x67f;
    }
  }
  microatf_fail_require
            ("%s:%d: %s not met",
             "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
             ,uVar4,pcVar3);
}

Assistant:

static void *
datagram_connector(void *arg)
{
	(void)arg;

	int sock = socket(PF_INET, SOCK_DGRAM | SOCK_CLOEXEC, 0);
	ATF_REQUIRE(sock >= 0);

	struct sockaddr_in addr = { 0 };
	addr.sin_family = AF_INET;
	addr.sin_port = htons(1337);
	ATF_REQUIRE(inet_pton(AF_INET, "127.0.0.1", &addr.sin_addr) == 1);

	ATF_REQUIRE(
	    connect(sock, (struct sockaddr const *)&addr, sizeof(addr)) == 0);

	fprintf(stderr, "got client\n");

	uint8_t data = '\0';
	write(sock, &data, 0);
	usleep(500000);
	close(sock);

	return NULL;
}